

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_strutils.cpp
# Opt level: O1

bool crnlib::string_to_uint64(char **pBuf,uint64 *value)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  char cVar7;
  ulong uVar8;
  char *pcVar9;
  
  *value = 0;
  pcVar9 = *pBuf;
  cVar7 = *pcVar9;
  while ((cVar7 != '\0' && (iVar2 = isspace((int)cVar7), iVar2 != 0))) {
    cVar7 = pcVar9[1];
    pcVar9 = pcVar9 + 1;
  }
  if ((int)cVar7 - 0x30U < 10) {
    uVar5 = 0;
    do {
      if ((*pcVar9 == '\0') || (uVar6 = (int)*pcVar9 - 0x30, 9 < uVar6)) {
        *value = uVar5;
        *pBuf = pcVar9;
        return true;
      }
      if (uVar5 >> 0x3d != 0) {
        return false;
      }
      if (CARRY8(uVar5 * 8,uVar5 * 2)) {
        bVar1 = false;
      }
      else {
        uVar3 = (ulong)uVar6;
        uVar8 = ~(uVar5 * 10);
        uVar4 = uVar3;
        if (uVar8 < uVar3) {
          uVar4 = 0;
        }
        bVar1 = uVar3 <= uVar8;
        uVar5 = uVar4 + uVar5 * 10;
        pcVar9 = pcVar9 + bVar1;
      }
    } while (bVar1);
  }
  return false;
}

Assistant:

bool string_to_uint64(const char*& pBuf, uint64& value)
    {
        value = 0;

        CRNLIB_ASSERT(pBuf);
        const char* p = pBuf;

        while (*p && isspace(*p))
        {
            p++;
        }

        uint64 result = 0;

        if (!isdigit(*p))
        {
            return false;
        }

        while (*p && isdigit(*p))
        {
            if (result & 0xE000000000000000ULL)
            {
                return false;
            }

            const uint64 result8 = result << 3U;
            const uint64 result2 = result << 1U;

            if (result2 > (0xFFFFFFFFFFFFFFFFULL - result8))
            {
                return false;
            }

            result = result8 + result2;

            uint c = p[0] - '0';
            if (c > (0xFFFFFFFFFFFFFFFFULL - result))
            {
                return false;
            }

            result += c;

            p++;
        }

        value = result;

        pBuf = p;

        return true;
    }